

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcore.cpp
# Opt level: O3

void baryonyx::context_register
               (context_ptr *ctx,solver_started_cb *start,solver_updated_cb *update,
               solver_finished_cb *finish)

{
  context *pcVar1;
  
  pcVar1 = (ctx->_M_t).super___uniq_ptr_impl<baryonyx::context,_void_(*)(baryonyx::context_*)>._M_t.
           super__Tuple_impl<0UL,_baryonyx::context_*,_void_(*)(baryonyx::context_*)>.
           super__Head_base<0UL,_baryonyx::context_*,_false>._M_head_impl;
  if (pcVar1 != (context *)0x0) {
    std::function<void_(const_baryonyx::solver_parameters_&)>::operator=(&pcVar1->start,start);
    std::function<void_(int,_double,_long,_double,_long)>::operator=
              (&((ctx->_M_t).super___uniq_ptr_impl<baryonyx::context,_void_(*)(baryonyx::context_*)>
                 ._M_t.super__Tuple_impl<0UL,_baryonyx::context_*,_void_(*)(baryonyx::context_*)>.
                 super__Head_base<0UL,_baryonyx::context_*,_false>._M_head_impl)->update,update);
    std::function<void_(const_baryonyx::result_&)>::operator=
              (&((ctx->_M_t).super___uniq_ptr_impl<baryonyx::context,_void_(*)(baryonyx::context_*)>
                 ._M_t.super__Tuple_impl<0UL,_baryonyx::context_*,_void_(*)(baryonyx::context_*)>.
                 super__Head_base<0UL,_baryonyx::context_*,_false>._M_head_impl)->finish,finish);
    return;
  }
  return;
}

Assistant:

void
context_register(const context_ptr& ctx,
                 solver_started_cb start,
                 solver_updated_cb update,
                 solver_finished_cb finish)
{
    if (ctx) {
        ctx->start = std::move(start);
        ctx->update = std::move(update);
        ctx->finish = std::move(finish);
    }
}